

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_rpc_sendstring_client.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  amqp_rpc_reply_t x_04;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 extraout_EDX;
  char *pcVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t sStackY_220;
  amqp_frame_t frame;
  undefined8 local_f0 [4];
  undefined8 local_d0 [4];
  undefined8 local_b0 [4];
  undefined8 local_90 [4];
  undefined8 local_70 [4];
  undefined8 local_50 [4];
  
  if (argc < 6) {
    fwrite("usage:\namqp_rpc_sendstring_client host port exchange routingkey messagebody\n",0x4c,1,
           _stderr);
  }
  else {
    pcVar13 = argv[1];
    iVar5 = atoi(argv[2]);
    pcVar1 = argv[3];
    pcVar2 = argv[4];
    pcVar3 = argv[5];
    uVar8 = amqp_new_connection();
    lVar9 = amqp_tcp_socket_new(uVar8);
    if (lVar9 == 0) {
      die("creating TCP socket");
    }
    iVar5 = amqp_socket_open(lVar9,pcVar13,iVar5);
    if (iVar5 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_50,uVar8,"/",0,0x20000,0,0,0x10307a,0x10307a);
    x.reply.id = (int)local_50[1];
    x._0_8_ = local_50[0];
    x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
    x.reply.decoded._0_4_ = (int)local_50[2];
    x.reply.decoded._4_4_ = (int)((ulong)local_50[2] >> 0x20);
    x.library_error = (int)local_50[3];
    x._28_4_ = (int)((ulong)local_50[3] >> 0x20);
    die_on_amqp_error(x,"Logging in");
    amqp_channel_open(uVar8,1);
    amqp_get_rpc_reply(local_70,uVar8);
    x_00.reply.id = (int)local_70[1];
    x_00._0_8_ = local_70[0];
    x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
    x_00.reply.decoded._0_4_ = (int)local_70[2];
    x_00.reply.decoded._4_4_ = (int)((ulong)local_70[2] >> 0x20);
    x_00.library_error = (int)local_70[3];
    x_00._28_4_ = (int)((ulong)local_70[3] >> 0x20);
    die_on_amqp_error(x_00,"Opening channel");
    uVar4 = _amqp_socket_open;
    uVar12 = _amqp_empty_bytes;
    puVar10 = (undefined8 *)
              amqp_queue_declare(uVar8,1,_amqp_empty_bytes,_amqp_socket_open,0,0,0,1,
                                 _amqp_empty_table,_putchar);
    amqp_get_rpc_reply(local_90,uVar8);
    x_01.reply.id = (int)local_90[1];
    x_01._0_8_ = local_90[0];
    x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
    x_01.reply.decoded._0_4_ = (int)local_90[2];
    x_01.reply.decoded._4_4_ = (int)((ulong)local_90[2] >> 0x20);
    x_01.library_error = (int)local_90[3];
    x_01._28_4_ = (int)((ulong)local_90[3] >> 0x20);
    die_on_amqp_error(x_01,"Declaring queue");
    auVar15 = amqp_bytes_malloc_dup(*puVar10,puVar10[1]);
    lVar9 = auVar15._8_8_;
    uVar11 = auVar15._0_8_;
    if (lVar9 != 0) {
      frame.frame_type = '\0';
      frame._1_1_ = 0x96;
      frame.channel = 0;
      frame.payload.method = (amqp_method_t)amqp_cstring_bytes("text/plain");
      auVar15 = amqp_bytes_malloc_dup(uVar11,lVar9);
      if (auVar15._8_8_ != 0) {
        amqp_cstring_bytes("1");
        auVar16 = amqp_cstring_bytes(pcVar1);
        auVar17 = amqp_cstring_bytes(pcVar2);
        uVar6 = amqp_cstring_bytes(pcVar3);
        iVar5 = amqp_basic_publish(uVar8,1,auVar16._0_8_,auVar16._8_8_,auVar17._0_8_,auVar17._8_8_,0
                                   ,0,(int)&frame,uVar6,extraout_EDX);
        die_on_error(iVar5,"Publishing");
        amqp_bytes_free(auVar15._0_8_,auVar15._8_8_);
        amqp_basic_consume(uVar8,1,uVar11,lVar9,uVar12,uVar4,0,1,0,_amqp_empty_table,_putchar);
        amqp_get_rpc_reply(local_b0,uVar8);
        x_02.reply.id = (int)local_b0[1];
        x_02._0_8_ = local_b0[0];
        x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
        x_02.reply.decoded._0_4_ = (int)local_b0[2];
        x_02.reply.decoded._4_4_ = (int)((ulong)local_b0[2] >> 0x20);
        x_02.library_error = (int)local_b0[3];
        x_02._28_4_ = (int)((ulong)local_b0[3] >> 0x20);
        die_on_amqp_error(x_02,"Consuming");
        amqp_bytes_free(uVar11,lVar9);
        do {
          do {
            amqp_maybe_release_buffers(uVar8);
            uVar7 = amqp_simple_wait_frame(uVar8,&frame);
            printf("Result: %d\n",(ulong)uVar7);
            if ((int)uVar7 < 0) goto LAB_0010277e;
            printf("Frame type: %d channel: %d\n",(ulong)frame.frame_type,(ulong)frame.channel);
          } while (frame.frame_type != '\x01');
          uVar12 = amqp_method_name(frame.payload.body_fragment.len & 0xffffffff);
          printf("Method: %s\n",uVar12);
        } while (frame.payload.method.id != 0x3c003c);
        printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
               (ulong)*(uint *)(frame.payload.properties.body_size + 0x10),
               (ulong)*(uint *)(frame.payload.properties.body_size + 0x20),
               *(undefined8 *)(frame.payload.properties.body_size + 0x28),
               (ulong)*(uint *)(frame.payload.properties.body_size + 0x30),
               *(undefined8 *)(frame.payload.properties.body_size + 0x38));
        iVar5 = amqp_simple_wait_frame(uVar8,&frame);
        if (-1 < iVar5) {
          if (frame.frame_type != '\x02') {
            pcVar13 = "Expected header!";
            sStackY_220 = 0x10;
LAB_0010286e:
            fwrite(pcVar13,sStackY_220,1,_stderr);
            abort();
          }
          if ((*(byte *)((long)frame.payload.properties.decoded + 1) & 0x80) != 0) {
            printf("Content-type: %.*s\n",
                   (ulong)*(uint *)((long)frame.payload.properties.decoded + 8),
                   *(undefined8 *)((long)frame.payload.properties.decoded + 0x10));
          }
          puts("----");
          uVar12 = frame.payload.method.decoded;
          pvVar14 = (void *)0x0;
          while (pvVar14 < (ulong)uVar12) {
            iVar5 = amqp_simple_wait_frame(uVar8,&frame);
            if (iVar5 < 0) break;
            if (frame.frame_type != '\x03') {
              pcVar13 = "Expected body!";
              sStackY_220 = 0xe;
              goto LAB_0010286e;
            }
            pvVar14 = (void *)((long)pvVar14 + frame.payload.body_fragment.len);
            amqp_dump(frame.payload.method.decoded,frame.payload.body_fragment.len);
          }
        }
LAB_0010277e:
        amqp_channel_close(local_d0,uVar8,1,200);
        x_03.reply.id = (int)local_d0[1];
        x_03._0_8_ = local_d0[0];
        x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
        x_03.reply.decoded._0_4_ = (int)local_d0[2];
        x_03.reply.decoded._4_4_ = (int)((ulong)local_d0[2] >> 0x20);
        x_03.library_error = (int)local_d0[3];
        x_03._28_4_ = (int)((ulong)local_d0[3] >> 0x20);
        die_on_amqp_error(x_03,"Closing channel");
        amqp_connection_close(local_f0,uVar8,200);
        x_04.reply.id = (int)local_f0[1];
        x_04._0_8_ = local_f0[0];
        x_04.reply._4_4_ = (int)((ulong)local_f0[1] >> 0x20);
        x_04.reply.decoded._0_4_ = (int)local_f0[2];
        x_04.reply.decoded._4_4_ = (int)((ulong)local_f0[2] >> 0x20);
        x_04.library_error = (int)local_f0[3];
        x_04._28_4_ = (int)((ulong)local_f0[3] >> 0x20);
        die_on_amqp_error(x_04,"Closing connection");
        iVar5 = amqp_destroy_connection(uVar8);
        die_on_error(iVar5,"Ending connection");
        return 0;
      }
    }
    fwrite("Out of memory while copying queue name",0x26,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *routingkey;
  char const *messagebody;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;
  amqp_bytes_t reply_to_queue;

  if (argc < 6) { /* minimum number of mandatory arguments */
    fprintf(stderr, "usage:\namqp_rpc_sendstring_client host port exchange routingkey messagebody\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  routingkey = argv[4];
  messagebody = argv[5];

  /*
     establish a channel that is used to connect RabbitMQ server
  */

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  /*
     create private reply_to queue
  */

  {
    amqp_queue_declare_ok_t *r = amqp_queue_declare(conn, 1, amqp_empty_bytes, 0, 0, 0, 1, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring queue");
    reply_to_queue = amqp_bytes_malloc_dup(r->queue);
    if (reply_to_queue.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
  }

  /*
     send the message
  */

  {
    /*
      set properties
    */
    amqp_basic_properties_t props;
    props._flags = AMQP_BASIC_CONTENT_TYPE_FLAG |
                   AMQP_BASIC_DELIVERY_MODE_FLAG |
                   AMQP_BASIC_REPLY_TO_FLAG |
                   AMQP_BASIC_CORRELATION_ID_FLAG;
    props.content_type = amqp_cstring_bytes("text/plain");
    props.delivery_mode = 2; /* persistent delivery mode */
    props.reply_to = amqp_bytes_malloc_dup(reply_to_queue);
    if (props.reply_to.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
    props.correlation_id = amqp_cstring_bytes("1");

    /*
      publish
    */
    die_on_error(amqp_basic_publish(conn,
                                    1,
                                    amqp_cstring_bytes(exchange),
                                    amqp_cstring_bytes(routingkey),
                                    0,
                                    0,
                                    &props,
                                    amqp_cstring_bytes(messagebody)),
                 "Publishing");

    amqp_bytes_free(props.reply_to);
  }

  /*
    wait an answer
  */

  {
    amqp_basic_consume(conn, 1, reply_to_queue, amqp_empty_bytes, 0, 1, 0, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Consuming");
    amqp_bytes_free(reply_to_queue);

    {
      amqp_frame_t frame;
      int result;

      amqp_basic_deliver_t *d;
      amqp_basic_properties_t *p;
      size_t body_target;
      size_t body_received;

      while (1) {
        amqp_maybe_release_buffers(conn);
        result = amqp_simple_wait_frame(conn, &frame);
        printf("Result: %d\n", result);
        if (result < 0) {
          break;
        }

        printf("Frame type: %d channel: %d\n", frame.frame_type, frame.channel);
        if (frame.frame_type != AMQP_FRAME_METHOD) {
          continue;
        }

        printf("Method: %s\n", amqp_method_name(frame.payload.method.id));
        if (frame.payload.method.id != AMQP_BASIC_DELIVER_METHOD) {
          continue;
        }

        d = (amqp_basic_deliver_t *) frame.payload.method.decoded;
        printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
               (unsigned) d->delivery_tag,
               (int) d->exchange.len, (char *) d->exchange.bytes,
               (int) d->routing_key.len, (char *) d->routing_key.bytes);

        result = amqp_simple_wait_frame(conn, &frame);
        if (result < 0) {
          break;
        }

        if (frame.frame_type != AMQP_FRAME_HEADER) {
          fprintf(stderr, "Expected header!");
          abort();
        }
        p = (amqp_basic_properties_t *) frame.payload.properties.decoded;
        if (p->_flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
          printf("Content-type: %.*s\n",
                 (int) p->content_type.len, (char *) p->content_type.bytes);
        }
        printf("----\n");

        body_target = frame.payload.properties.body_size;
        body_received = 0;

        while (body_received < body_target) {
          result = amqp_simple_wait_frame(conn, &frame);
          if (result < 0) {
            break;
          }

          if (frame.frame_type != AMQP_FRAME_BODY) {
            fprintf(stderr, "Expected body!");
            abort();
          }

          body_received += frame.payload.body_fragment.len;
          assert(body_received <= body_target);

          amqp_dump(frame.payload.body_fragment.bytes,
                    frame.payload.body_fragment.len);
        }

        if (body_received != body_target) {
          /* Can only happen when amqp_simple_wait_frame returns <= 0 */
          /* We break here to close the connection */
          break;
        }

        /* everything was fine, we can quit now because we received the reply */
        break;
      }

    }
  }

  /*
     closing
  */

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  return 0;
}